

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDateTime>::moveAppend
          (QGenericArrayOps<QDateTime> *this,QDateTime *b,QDateTime *e)

{
  QDateTime *pQVar1;
  QDateTime *in_RDX;
  QDateTime *in_RSI;
  long in_RDI;
  QDateTime *data;
  QDateTime *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QDateTime>::begin((QArrayDataPointer<QDateTime> *)0x1d62a7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QDateTime::QDateTime(pQVar1 + *(long *)(in_RDI + 0x10) * 8,local_10);
      local_10 = local_10 + 8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }